

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_muxer_metadata.cc
# Opt level: O1

bool __thiscall SampleMuxerMetadata::LoadChapters(SampleMuxerMetadata *this,char *file)

{
  size_t sVar1;
  bool bVar2;
  cue_list_t cues;
  _List_base<libwebvtt::Cue,_std::allocator<libwebvtt::Cue>_> local_38;
  
  local_38._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_38;
  local_38._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_38;
  if ((this->chapter_cues_).super__List_base<libwebvtt::Cue,_std::allocator<libwebvtt::Cue>_>.
      _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&this->chapter_cues_) {
    local_38._M_impl._M_node._M_size = 0;
    bVar2 = ParseChapters(file,(cue_list_t *)&local_38);
    if (bVar2) {
      std::__detail::_List_node_base::swap
                ((_List_node_base *)&this->chapter_cues_,(_List_node_base *)&local_38);
      sVar1 = (this->chapter_cues_).
              super__List_base<libwebvtt::Cue,_std::allocator<libwebvtt::Cue>_>._M_impl._M_node.
              _M_size;
      (this->chapter_cues_).super__List_base<libwebvtt::Cue,_std::allocator<libwebvtt::Cue>_>.
      _M_impl._M_node._M_size = local_38._M_impl._M_node._M_size;
      local_38._M_impl._M_node._M_size = sVar1;
    }
    std::__cxx11::_List_base<libwebvtt::Cue,_std::allocator<libwebvtt::Cue>_>::_M_clear(&local_38);
  }
  else {
    puts("Support for more than one chapters file is not yet implemented");
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool SampleMuxerMetadata::LoadChapters(const char* file) {
  if (!chapter_cues_.empty()) {
    printf("Support for more than one chapters file is not yet implemented\n");
    return false;
  }

  cue_list_t cues;

  if (!ParseChapters(file, &cues))
    return false;

  // TODO(matthewjheaney): support more than one chapters file
  chapter_cues_.swap(cues);

  return true;
}